

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  ArrayIndex AVar3;
  undefined4 extraout_var;
  Value *root;
  ulong uVar4;
  long lVar5;
  string local_68;
  ulong local_48;
  pointer local_40;
  pointer local_38;
  
  AVar3 = Value::size(value);
  local_48 = CONCAT44(extraout_var,AVar3);
  if (AVar3 == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[]","");
    pushValue(this,&local_68);
  }
  else {
    bVar2 = isMultineArray(this,value);
    if (!bVar2) {
      uVar4 = (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 == (local_48 & 0xffffffff)) {
        std::__ostream_insert<char,std::char_traits<char>>(this->document_,"[ ",2);
        lVar5 = 0;
        do {
          if (lVar5 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(this->document_,", ",2);
          }
          pbVar1 = (this->childValues_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->document_,*(char **)((long)&(pbVar1->_M_dataplus)._M_p + lVar5),
                     *(long *)((long)&pbVar1->_M_string_length + lVar5));
          lVar5 = lVar5 + 0x20;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
        std::__ostream_insert<char,std::char_traits<char>>(this->document_," ]",2);
        return;
      }
      __assert_fail("childValues_.size() == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_writer.cpp"
                    ,0x2a6,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[","");
    writeIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append
              ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
    local_38 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (this->childValues_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = (ulong)((int)local_48 - 1);
    lVar5 = 8;
    uVar4 = 0;
    while( true ) {
      root = Value::operator[](value,(ArrayIndex)uVar4);
      writeCommentBeforeValue(this,root);
      if (local_38 == local_40) {
        writeIndent(this);
        writeValue(this,root);
      }
      else {
        pbVar1 = (this->childValues_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        writeIndent(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->document_,*(char **)((long)pbVar1 + lVar5 + -8),
                   *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
      }
      if (local_48 == uVar4) break;
      uVar4 = uVar4 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(this->document_,",",1);
      writeCommentAfterValueOnSameLine(this,root);
      lVar5 = lVar5 + 0x20;
    }
    writeCommentAfterValueOnSameLine(this,root);
    unindent(this);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"]","");
    writeIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>
              (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void 
StyledStreamWriter::writeArrayValue( const Value &value )
{
   unsigned size = value.size();
   if ( size == 0 )
      pushValue( "[]" );
   else
   {
      bool isArrayMultiLine = isMultineArray( value );
      if ( isArrayMultiLine )
      {
         writeWithIndent( "[" );
         indent();
         bool hasChildValue = !childValues_.empty();
         unsigned index =0;
         for (;;)
         {
            const Value &childValue = value[index];
            writeCommentBeforeValue( childValue );
            if ( hasChildValue )
               writeWithIndent( childValues_[index] );
            else
            {
               writeIndent();
               writeValue( childValue );
            }
            if ( ++index == size )
            {
               writeCommentAfterValueOnSameLine( childValue );
               break;
            }
            *document_ << ",";
            writeCommentAfterValueOnSameLine( childValue );
         }
         unindent();
         writeWithIndent( "]" );
      }
      else // output on a single line
      {
         assert( childValues_.size() == size );
         *document_ << "[ ";
         for ( unsigned index =0; index < size; ++index )
         {
            if ( index > 0 )
               *document_ << ", ";
            *document_ << childValues_[index];
         }
         *document_ << " ]";
      }
   }
}